

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O1

void __thiscall smf::MidiEventList::removeEmpties(MidiEventList *this)

{
  pointer ppMVar1;
  MidiEvent *this_00;
  MidiEvent **ppMVar2;
  pointer ppMVar3;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *__range1;
  int iVar4;
  MidiEvent **item_1;
  MidiEvent **__args;
  MidiEvent **item;
  pointer ppMVar5;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> newlist;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> local_48;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (ppMVar5 = (this->list).
                 super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar5 != ppMVar1; ppMVar5 = ppMVar5 + 1) {
    this_00 = *ppMVar5;
    if ((this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      MidiEvent::~MidiEvent(this_00);
      operator_delete(this_00);
      *ppMVar5 = (MidiEvent *)0x0;
      iVar4 = iVar4 + 1;
    }
  }
  if (iVar4 != 0) {
    local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (MidiEvent **)0x0;
    local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (MidiEvent **)0x0;
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
              (&local_48,
               ((long)(this->list).
                      super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->list).
                      super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) - (long)iVar4);
    ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (__args = (this->list).
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_start; __args != ppMVar2; __args = __args + 1) {
      if (*__args != (MidiEvent *)0x0) {
        if (local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
            .super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
          _M_realloc_insert<smf::MidiEvent*const&>
                    ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)&local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
                     .super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
           super__Vector_impl_data._M_finish = *__args;
          local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    ppMVar5 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppMVar3 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (ppMVar5 != (pointer)0x0) {
      local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppMVar5;
      local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppMVar1;
      local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppMVar3;
      operator_delete(ppMVar5);
    }
  }
  return;
}

Assistant:

void MidiEventList::removeEmpties(void) {
	int count = 0;
	for (auto& item : list) {
		if (item->empty()) {
			delete item;
			item = NULL;
			count++;
		}
	}
	if (count == 0) {
		return;
	}
	std::vector<MidiEvent*> newlist;
	newlist.reserve(list.size() - count);
	for (auto& item : list) {
		if (item) {
			newlist.push_back(item);
		}
	}
	list.swap(newlist);
}